

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::on_oct
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  uint uVar1;
  int iVar2;
  long in_RDI;
  int in_stack_0000000c;
  basic_writer<fmt::v6::buffer_range<char>_> *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined1 in_stack_00000028 [16];
  bin_writer<3> in_stack_00000040;
  int num_digits;
  
  iVar2 = count_digits<3u,unsigned_long>(*(unsigned_long *)(in_RDI + 0x10));
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) && (*(long *)(in_RDI + 0x10) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar1 + 1;
    *(undefined1 *)(in_RDI + 0x18 + (ulong)uVar1) = 0x30;
  }
  get_prefix((int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *)0x142c34);
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
            (in_stack_00000010,in_stack_0000000c,(string_view)in_stack_00000028,
             (format_specs)in_stack_00000018,in_stack_00000040);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }